

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt32
          (OptionInterpreter *this,int number,uint32_t value,Type type,
          UnknownFieldSet *unknown_fields)

{
  string_view str;
  Type local_1c;
  LogMessage local_18;
  
  local_1c = type;
  if (type == TYPE_FIXED32) {
    UnknownFieldSet::AddFixed32(unknown_fields,number,value);
    return;
  }
  if (type == TYPE_UINT32) {
    UnknownFieldSet::AddVarint(unknown_fields,number,(ulong)value);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x283a);
  str._M_str = "Invalid wire type for CPPTYPE_UINT32: ";
  str._M_len = 0x26;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_18,str);
  absl::lts_20250127::log_internal::LogMessage::
  operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>(&local_18,&local_1c);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_18);
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt32(
    int number, uint32_t value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT32:
      unknown_fields->AddVarint(number, static_cast<uint64_t>(value));
      break;

    case FieldDescriptor::TYPE_FIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32_t>(value));
      break;

    default:
      ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT32: " << type;
      break;
  }
}